

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O2

string * __thiscall
adios2::format::BP4Base::GetBPSubStreamName
          (string *__return_storage_ptr__,BP4Base *this,string *name,size_t id,bool hasSubFiles,
          bool isReader)

{
  undefined3 in_register_00000081;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string bpName;
  
  if (CONCAT31(in_register_00000081,hasSubFiles) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    helper::RemoveTrailingSlash(&bpName,name);
    if ((!isReader) && ((&this->field_0x329)[(long)this->_vptr_BP4Base[-3]] == '\x01')) {
      id = *(size_t *)(&this->field_0x308 + (long)this->_vptr_BP4Base[-3]);
    }
    std::operator+(&local_80,&bpName,'/');
    std::operator+(&local_60,&local_80,"data.");
    std::__cxx11::to_string(&local_a0,id);
    std::operator+(__return_storage_ptr__,&local_60,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&bpName);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BP4Base::GetBPSubStreamName(const std::string &name, const size_t id,
                                        const bool hasSubFiles, const bool isReader) const noexcept
{
    if (!hasSubFiles)
    {
        return name;
    }

    const std::string bpName = helper::RemoveTrailingSlash(name);

    const size_t index = isReader                  ? id
                         : m_Aggregator.m_IsActive ? m_Aggregator.m_SubStreamIndex
                                                   : id;

    /* the name of a data file starts with "data." */
    const std::string bpRankName(bpName + PathSeparator + "data." + std::to_string(index));
    return bpRankName;
}